

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O0

void __thiscall jaegertracing::net::URI_testMatch_Test::TestBody(URI_testMatch_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1d8 [8];
  Message local_1d0 [15];
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [64];
  int local_160 [19];
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_f8 [8];
  Message local_f0 [31];
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [64];
  undefined1 local_70 [76];
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  URI_testMatch_Test *this_local;
  
  local_24 = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"http://localhost",&local_d1);
  jaegertracing::net::URI::parse(local_b0);
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_20,"0",(int *)"URI::parse(\"http://localhost\")._port",&local_24,local_70);
  URI::~URI((URI *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    testing::Message::~Message(local_f0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_114 = 0x50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"http://localhost:80",&local_1c1);
    jaegertracing::net::URI::parse(local_1a0);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_110,"80","URI::parse(\"http://localhost:80\")._port",
               &local_114,local_160);
    URI::~URI((URI *)local_1a0);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(local_1d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
      testing::internal::AssertHelper::AssertHelper
                (local_1d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x1f,pcVar2);
      testing::internal::AssertHelper::operator=(local_1d8,local_1d0);
      testing::internal::AssertHelper::~AssertHelper(local_1d8);
      testing::Message::~Message(local_1d0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  }
  return;
}

Assistant:

TEST(URI, testMatch)
{
    ASSERT_EQ(0, URI::parse("http://localhost")._port);
    ASSERT_EQ(80, URI::parse("http://localhost:80")._port);
}